

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::detail::FieldMatcher<int(anonymous_namespace)::X::*,int>::operator()
          (AssertionResult *__return_storage_ptr__,
          FieldMatcher<int(anonymous_namespace)::X::*,int> *this,X *actual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  AssertionResult *extraout_RAX;
  AssertionResult *extraout_RAX_00;
  AssertionResult local_68;
  string local_40;
  
  local_40._M_string_length = (size_type)(this + 0x10);
  local_40._M_dataplus._M_p = (pointer)&PTR__IMatcher_0023c380;
  EqMatcher<int>::operator()
            (&local_68,(EqMatcher<int> *)&local_40,
             (int *)((long)&(anonymous_namespace)::gx + **(long **)(this + 8)));
  paVar1 = &local_68.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_message._M_dataplus._M_p,
                    CONCAT71(local_68.m_message.field_2._M_allocated_capacity._1_7_,
                             local_68.m_message.field_2._M_local_buf[0]) + 1);
  }
  if (local_68.m_result == false) {
    local_68.m_message._M_string_length = 0;
    local_68.m_message.field_2._M_local_buf[0] = '\0';
    local_68.m_result = false;
    local_68.m_message._M_dataplus._M_p = (pointer)paVar1;
    WhichIs_abi_cxx11_(&local_40,this);
    pAVar3 = AssertionResult::operator<<(&local_68,&local_40);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    pAVar3 = (AssertionResult *)&local_40.field_2;
    if ((AssertionResult *)local_40._M_dataplus._M_p != pAVar3) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pAVar3 = extraout_RAX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.m_message._M_dataplus._M_p,
                      CONCAT71(local_68.m_message.field_2._M_allocated_capacity._1_7_,
                               local_68.m_message.field_2._M_local_buf[0]) + 1);
      pAVar3 = extraout_RAX_00;
    }
  }
  else {
    pAVar3 = (AssertionResult *)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)pAVar3;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return pAVar3;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }